

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_8x8(int16_t *input,__m128i *in,int stride,int flipud,int fliplr,int shift)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 *puVar10;
  int in_ECX;
  int in_EDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*pauVar11) [16];
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 auVar12 [16];
  __m128i x;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  __m128i x_05;
  __m128i x_06;
  __m128i u;
  undefined8 local_4b8;
  undefined8 local_478;
  undefined8 local_458;
  undefined8 local_438;
  undefined8 local_418;
  undefined8 local_3f8;
  undefined8 local_3d8;
  undefined8 local_3b8;
  undefined8 local_398;
  int local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  int local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  int local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  int local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  int local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  int local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  int local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  int local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  int local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  int local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  int local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  int local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  int local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  int local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  int local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  int local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_180;
  undefined4 uStack_160;
  undefined4 uStack_140;
  undefined4 uStack_120;
  undefined4 uStack_100;
  undefined4 uStack_e0;
  undefined4 uStack_c0;
  undefined4 uStack_a0;
  
  if (in_ECX == 0) {
    uVar2 = in_RDI[1];
    *(undefined8 *)*in_RSI = *in_RDI;
    *(undefined8 *)(*in_RSI + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)in_EDX * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[1] = *puVar10;
    *(undefined8 *)(in_RSI[1] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 1) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[2] = *puVar10;
    *(undefined8 *)(in_RSI[2] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 3) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[3] = *puVar10;
    *(undefined8 *)(in_RSI[3] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 2) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[4] = *puVar10;
    *(undefined8 *)(in_RSI[4] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 5) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[5] = *puVar10;
    *(undefined8 *)(in_RSI[5] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 6) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[6] = *puVar10;
    *(undefined8 *)(in_RSI[6] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 7) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[7] = *puVar10;
    *(undefined8 *)(in_RSI[7] + 8) = uVar2;
  }
  else {
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 7) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)*in_RSI = *puVar10;
    *(undefined8 *)(*in_RSI + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 6) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[1] = *puVar10;
    *(undefined8 *)(in_RSI[1] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 5) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[2] = *puVar10;
    *(undefined8 *)(in_RSI[2] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 2) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[3] = *puVar10;
    *(undefined8 *)(in_RSI[3] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 3) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[4] = *puVar10;
    *(undefined8 *)(in_RSI[4] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 1) * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[5] = *puVar10;
    *(undefined8 *)(in_RSI[5] + 8) = uVar2;
    puVar10 = (undefined8 *)((long)in_RDI + (long)in_EDX * 2);
    uVar2 = puVar10[1];
    *(undefined8 *)in_RSI[6] = *puVar10;
    *(undefined8 *)(in_RSI[6] + 8) = uVar2;
    uVar2 = in_RDI[1];
    *(undefined8 *)in_RSI[7] = *in_RDI;
    *(undefined8 *)(in_RSI[7] + 8) = uVar2;
  }
  if (in_R8D != 0) {
    x[1] = (longlong)in_RSI;
    x[0] = (longlong)in_RDI;
    pauVar11 = in_RSI;
    mm_reverse_epi16(x);
    *(undefined8 *)*in_RSI = extraout_XMM0_Qa;
    *(undefined8 *)(*in_RSI + 8) = extraout_XMM0_Qb;
    x_00[1] = (longlong)pauVar11;
    x_00[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_00);
    *(undefined8 *)in_RSI[1] = extraout_XMM0_Qa_00;
    *(undefined8 *)(in_RSI[1] + 8) = extraout_XMM0_Qb_00;
    x_01[1] = (longlong)pauVar11;
    x_01[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_01);
    *(undefined8 *)in_RSI[2] = extraout_XMM0_Qa_01;
    *(undefined8 *)(in_RSI[2] + 8) = extraout_XMM0_Qb_01;
    x_02[1] = (longlong)pauVar11;
    x_02[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_02);
    *(undefined8 *)in_RSI[3] = extraout_XMM0_Qa_02;
    *(undefined8 *)(in_RSI[3] + 8) = extraout_XMM0_Qb_02;
    x_03[1] = (longlong)pauVar11;
    x_03[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_03);
    *(undefined8 *)in_RSI[4] = extraout_XMM0_Qa_03;
    *(undefined8 *)(in_RSI[4] + 8) = extraout_XMM0_Qb_03;
    x_04[1] = (longlong)pauVar11;
    x_04[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_04);
    *(undefined8 *)in_RSI[5] = extraout_XMM0_Qa_04;
    *(undefined8 *)(in_RSI[5] + 8) = extraout_XMM0_Qb_04;
    x_05[1] = (longlong)pauVar11;
    x_05[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_05);
    *(undefined8 *)in_RSI[6] = extraout_XMM0_Qa_05;
    *(undefined8 *)(in_RSI[6] + 8) = extraout_XMM0_Qb_05;
    x_06[1] = (longlong)pauVar11;
    x_06[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_06);
    *(undefined8 *)in_RSI[7] = extraout_XMM0_Qa_06;
    *(undefined8 *)(in_RSI[7] + 8) = extraout_XMM0_Qb_06;
  }
  uVar1 = *(undefined4 *)(in_RSI[4] + 0xc);
  local_398 = SUB168(in_RSI[4],0);
  auVar12 = pmovsxwd(in_RSI[4],local_398);
  in_RSI[8] = auVar12;
  auVar12._8_4_ = uStack_a0;
  auVar12._0_8_ = local_4b8;
  auVar12._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar12,local_4b8);
  in_RSI[9] = auVar12;
  uVar1 = *(undefined4 *)(in_RSI[5] + 0xc);
  local_3b8 = SUB168(in_RSI[5],0);
  auVar12 = pmovsxwd(in_RSI[5],local_3b8);
  in_RSI[10] = auVar12;
  auVar3._8_4_ = uStack_c0;
  auVar3._0_8_ = local_4b8;
  auVar3._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar3,local_4b8);
  in_RSI[0xb] = auVar12;
  uVar1 = *(undefined4 *)(in_RSI[6] + 0xc);
  local_3d8 = SUB168(in_RSI[6],0);
  auVar12 = pmovsxwd(in_RSI[6],local_3d8);
  in_RSI[0xc] = auVar12;
  auVar4._8_4_ = uStack_e0;
  auVar4._0_8_ = local_4b8;
  auVar4._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar4,local_4b8);
  in_RSI[0xd] = auVar12;
  uVar1 = *(undefined4 *)(in_RSI[7] + 0xc);
  local_3f8 = SUB168(in_RSI[7],0);
  auVar12 = pmovsxwd(in_RSI[7],local_3f8);
  in_RSI[0xe] = auVar12;
  auVar5._8_4_ = uStack_100;
  auVar5._0_8_ = local_4b8;
  auVar5._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar5,local_4b8);
  in_RSI[0xf] = auVar12;
  uVar1 = *(undefined4 *)(in_RSI[3] + 0xc);
  local_418 = SUB168(in_RSI[3],0);
  auVar12 = pmovsxwd(in_RSI[3],local_418);
  in_RSI[6] = auVar12;
  auVar6._8_4_ = uStack_120;
  auVar6._0_8_ = local_4b8;
  auVar6._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar6,local_4b8);
  in_RSI[7] = auVar12;
  uVar1 = *(undefined4 *)(in_RSI[2] + 0xc);
  local_438 = SUB168(in_RSI[2],0);
  auVar12 = pmovsxwd(in_RSI[2],local_438);
  in_RSI[4] = auVar12;
  auVar7._8_4_ = uStack_140;
  auVar7._0_8_ = local_4b8;
  auVar7._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar7,local_4b8);
  in_RSI[5] = auVar12;
  uVar1 = *(undefined4 *)(in_RSI[1] + 0xc);
  local_458 = SUB168(in_RSI[1],0);
  auVar12 = pmovsxwd(in_RSI[1],local_458);
  in_RSI[2] = auVar12;
  auVar8._8_4_ = uStack_160;
  auVar8._0_8_ = local_4b8;
  auVar8._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar8,local_4b8);
  in_RSI[3] = auVar12;
  uVar1 = *(undefined4 *)(*in_RSI + 0xc);
  local_478 = SUB168(*in_RSI,0);
  auVar12 = pmovsxwd(*in_RSI,local_478);
  *in_RSI = auVar12;
  auVar9._8_4_ = uStack_180;
  auVar9._0_8_ = local_4b8;
  auVar9._12_4_ = uVar1;
  auVar12 = pmovsxwd(auVar9,local_4b8);
  in_RSI[1] = auVar12;
  local_198 = (int)*(undefined8 *)*in_RSI;
  uStack_194 = (undefined4)((ulong)*(undefined8 *)*in_RSI >> 0x20);
  uStack_190 = (undefined4)*(undefined8 *)(*in_RSI + 8);
  uStack_18c = (undefined4)((ulong)*(undefined8 *)(*in_RSI + 8) >> 0x20);
  *(int *)*in_RSI = local_198 << in_R9D;
  *(undefined4 *)(*in_RSI + 4) = uStack_194;
  *(undefined4 *)(*in_RSI + 8) = uStack_190;
  *(undefined4 *)(*in_RSI + 0xc) = uStack_18c;
  local_1b8 = (int)*(undefined8 *)in_RSI[1];
  uStack_1b4 = (undefined4)((ulong)*(undefined8 *)in_RSI[1] >> 0x20);
  uStack_1b0 = (undefined4)*(undefined8 *)(in_RSI[1] + 8);
  uStack_1ac = (undefined4)((ulong)*(undefined8 *)(in_RSI[1] + 8) >> 0x20);
  *(int *)in_RSI[1] = local_1b8 << in_R9D;
  *(undefined4 *)(in_RSI[1] + 4) = uStack_1b4;
  *(undefined4 *)(in_RSI[1] + 8) = uStack_1b0;
  *(undefined4 *)(in_RSI[1] + 0xc) = uStack_1ac;
  local_1d8 = (int)*(undefined8 *)in_RSI[2];
  uStack_1d4 = (undefined4)((ulong)*(undefined8 *)in_RSI[2] >> 0x20);
  uStack_1d0 = (undefined4)*(undefined8 *)(in_RSI[2] + 8);
  uStack_1cc = (undefined4)((ulong)*(undefined8 *)(in_RSI[2] + 8) >> 0x20);
  *(int *)in_RSI[2] = local_1d8 << in_R9D;
  *(undefined4 *)(in_RSI[2] + 4) = uStack_1d4;
  *(undefined4 *)(in_RSI[2] + 8) = uStack_1d0;
  *(undefined4 *)(in_RSI[2] + 0xc) = uStack_1cc;
  local_1f8 = (int)*(undefined8 *)in_RSI[3];
  uStack_1f4 = (undefined4)((ulong)*(undefined8 *)in_RSI[3] >> 0x20);
  uStack_1f0 = (undefined4)*(undefined8 *)(in_RSI[3] + 8);
  uStack_1ec = (undefined4)((ulong)*(undefined8 *)(in_RSI[3] + 8) >> 0x20);
  *(int *)in_RSI[3] = local_1f8 << in_R9D;
  *(undefined4 *)(in_RSI[3] + 4) = uStack_1f4;
  *(undefined4 *)(in_RSI[3] + 8) = uStack_1f0;
  *(undefined4 *)(in_RSI[3] + 0xc) = uStack_1ec;
  local_218 = (int)*(undefined8 *)in_RSI[4];
  uStack_214 = (undefined4)((ulong)*(undefined8 *)in_RSI[4] >> 0x20);
  uStack_210 = (undefined4)*(undefined8 *)(in_RSI[4] + 8);
  uStack_20c = (undefined4)((ulong)*(undefined8 *)(in_RSI[4] + 8) >> 0x20);
  *(int *)in_RSI[4] = local_218 << in_R9D;
  *(undefined4 *)(in_RSI[4] + 4) = uStack_214;
  *(undefined4 *)(in_RSI[4] + 8) = uStack_210;
  *(undefined4 *)(in_RSI[4] + 0xc) = uStack_20c;
  local_238 = (int)*(undefined8 *)in_RSI[5];
  uStack_234 = (undefined4)((ulong)*(undefined8 *)in_RSI[5] >> 0x20);
  uStack_230 = (undefined4)*(undefined8 *)(in_RSI[5] + 8);
  uStack_22c = (undefined4)((ulong)*(undefined8 *)(in_RSI[5] + 8) >> 0x20);
  *(int *)in_RSI[5] = local_238 << in_R9D;
  *(undefined4 *)(in_RSI[5] + 4) = uStack_234;
  *(undefined4 *)(in_RSI[5] + 8) = uStack_230;
  *(undefined4 *)(in_RSI[5] + 0xc) = uStack_22c;
  local_258 = (int)*(undefined8 *)in_RSI[6];
  uStack_254 = (undefined4)((ulong)*(undefined8 *)in_RSI[6] >> 0x20);
  uStack_250 = (undefined4)*(undefined8 *)(in_RSI[6] + 8);
  uStack_24c = (undefined4)((ulong)*(undefined8 *)(in_RSI[6] + 8) >> 0x20);
  *(int *)in_RSI[6] = local_258 << in_R9D;
  *(undefined4 *)(in_RSI[6] + 4) = uStack_254;
  *(undefined4 *)(in_RSI[6] + 8) = uStack_250;
  *(undefined4 *)(in_RSI[6] + 0xc) = uStack_24c;
  local_278 = (int)*(undefined8 *)in_RSI[7];
  uStack_274 = (undefined4)((ulong)*(undefined8 *)in_RSI[7] >> 0x20);
  uStack_270 = (undefined4)*(undefined8 *)(in_RSI[7] + 8);
  uStack_26c = (undefined4)((ulong)*(undefined8 *)(in_RSI[7] + 8) >> 0x20);
  *(int *)in_RSI[7] = local_278 << in_R9D;
  *(undefined4 *)(in_RSI[7] + 4) = uStack_274;
  *(undefined4 *)(in_RSI[7] + 8) = uStack_270;
  *(undefined4 *)(in_RSI[7] + 0xc) = uStack_26c;
  local_298 = (int)*(undefined8 *)in_RSI[8];
  uStack_294 = (undefined4)((ulong)*(undefined8 *)in_RSI[8] >> 0x20);
  uStack_290 = (undefined4)*(undefined8 *)(in_RSI[8] + 8);
  uStack_28c = (undefined4)((ulong)*(undefined8 *)(in_RSI[8] + 8) >> 0x20);
  *(int *)in_RSI[8] = local_298 << in_R9D;
  *(undefined4 *)(in_RSI[8] + 4) = uStack_294;
  *(undefined4 *)(in_RSI[8] + 8) = uStack_290;
  *(undefined4 *)(in_RSI[8] + 0xc) = uStack_28c;
  local_2b8 = (int)*(undefined8 *)in_RSI[9];
  uStack_2b4 = (undefined4)((ulong)*(undefined8 *)in_RSI[9] >> 0x20);
  uStack_2b0 = (undefined4)*(undefined8 *)(in_RSI[9] + 8);
  uStack_2ac = (undefined4)((ulong)*(undefined8 *)(in_RSI[9] + 8) >> 0x20);
  *(int *)in_RSI[9] = local_2b8 << in_R9D;
  *(undefined4 *)(in_RSI[9] + 4) = uStack_2b4;
  *(undefined4 *)(in_RSI[9] + 8) = uStack_2b0;
  *(undefined4 *)(in_RSI[9] + 0xc) = uStack_2ac;
  local_2d8 = (int)*(undefined8 *)in_RSI[10];
  uStack_2d4 = (undefined4)((ulong)*(undefined8 *)in_RSI[10] >> 0x20);
  uStack_2d0 = (undefined4)*(undefined8 *)(in_RSI[10] + 8);
  uStack_2cc = (undefined4)((ulong)*(undefined8 *)(in_RSI[10] + 8) >> 0x20);
  *(int *)in_RSI[10] = local_2d8 << in_R9D;
  *(undefined4 *)(in_RSI[10] + 4) = uStack_2d4;
  *(undefined4 *)(in_RSI[10] + 8) = uStack_2d0;
  *(undefined4 *)(in_RSI[10] + 0xc) = uStack_2cc;
  local_2f8 = (int)*(undefined8 *)in_RSI[0xb];
  uStack_2f4 = (undefined4)((ulong)*(undefined8 *)in_RSI[0xb] >> 0x20);
  uStack_2f0 = (undefined4)*(undefined8 *)(in_RSI[0xb] + 8);
  uStack_2ec = (undefined4)((ulong)*(undefined8 *)(in_RSI[0xb] + 8) >> 0x20);
  *(int *)in_RSI[0xb] = local_2f8 << in_R9D;
  *(undefined4 *)(in_RSI[0xb] + 4) = uStack_2f4;
  *(undefined4 *)(in_RSI[0xb] + 8) = uStack_2f0;
  *(undefined4 *)(in_RSI[0xb] + 0xc) = uStack_2ec;
  local_318 = (int)*(undefined8 *)in_RSI[0xc];
  uStack_314 = (undefined4)((ulong)*(undefined8 *)in_RSI[0xc] >> 0x20);
  uStack_310 = (undefined4)*(undefined8 *)(in_RSI[0xc] + 8);
  uStack_30c = (undefined4)((ulong)*(undefined8 *)(in_RSI[0xc] + 8) >> 0x20);
  *(int *)in_RSI[0xc] = local_318 << in_R9D;
  *(undefined4 *)(in_RSI[0xc] + 4) = uStack_314;
  *(undefined4 *)(in_RSI[0xc] + 8) = uStack_310;
  *(undefined4 *)(in_RSI[0xc] + 0xc) = uStack_30c;
  local_338 = (int)*(undefined8 *)in_RSI[0xd];
  uStack_334 = (undefined4)((ulong)*(undefined8 *)in_RSI[0xd] >> 0x20);
  uStack_330 = (undefined4)*(undefined8 *)(in_RSI[0xd] + 8);
  uStack_32c = (undefined4)((ulong)*(undefined8 *)(in_RSI[0xd] + 8) >> 0x20);
  *(int *)in_RSI[0xd] = local_338 << in_R9D;
  *(undefined4 *)(in_RSI[0xd] + 4) = uStack_334;
  *(undefined4 *)(in_RSI[0xd] + 8) = uStack_330;
  *(undefined4 *)(in_RSI[0xd] + 0xc) = uStack_32c;
  local_358 = (int)*(undefined8 *)in_RSI[0xe];
  uStack_354 = (undefined4)((ulong)*(undefined8 *)in_RSI[0xe] >> 0x20);
  uStack_350 = (undefined4)*(undefined8 *)(in_RSI[0xe] + 8);
  uStack_34c = (undefined4)((ulong)*(undefined8 *)(in_RSI[0xe] + 8) >> 0x20);
  *(int *)in_RSI[0xe] = local_358 << in_R9D;
  *(undefined4 *)(in_RSI[0xe] + 4) = uStack_354;
  *(undefined4 *)(in_RSI[0xe] + 8) = uStack_350;
  *(undefined4 *)(in_RSI[0xe] + 0xc) = uStack_34c;
  local_378 = (int)*(undefined8 *)in_RSI[0xf];
  uStack_374 = (undefined4)((ulong)*(undefined8 *)in_RSI[0xf] >> 0x20);
  uStack_370 = (undefined4)*(undefined8 *)(in_RSI[0xf] + 8);
  uStack_36c = (undefined4)((ulong)*(undefined8 *)(in_RSI[0xf] + 8) >> 0x20);
  *(int *)in_RSI[0xf] = local_378 << in_R9D;
  *(undefined4 *)(in_RSI[0xf] + 4) = uStack_374;
  *(undefined4 *)(in_RSI[0xf] + 8) = uStack_370;
  *(undefined4 *)(in_RSI[0xf] + 0xc) = uStack_36c;
  return;
}

Assistant:

static inline void load_buffer_8x8(const int16_t *input, __m128i *in,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  __m128i u;
  if (!flipud) {
    in[0] = _mm_load_si128((const __m128i *)(input + 0 * stride));
    in[1] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    in[2] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    in[3] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    in[4] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    in[5] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    in[6] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    in[7] = _mm_load_si128((const __m128i *)(input + 7 * stride));
  } else {
    in[0] = _mm_load_si128((const __m128i *)(input + 7 * stride));
    in[1] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    in[2] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    in[3] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    in[4] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    in[5] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    in[6] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    in[7] = _mm_load_si128((const __m128i *)(input + 0 * stride));
  }

  if (fliplr) {
    in[0] = mm_reverse_epi16(in[0]);
    in[1] = mm_reverse_epi16(in[1]);
    in[2] = mm_reverse_epi16(in[2]);
    in[3] = mm_reverse_epi16(in[3]);
    in[4] = mm_reverse_epi16(in[4]);
    in[5] = mm_reverse_epi16(in[5]);
    in[6] = mm_reverse_epi16(in[6]);
    in[7] = mm_reverse_epi16(in[7]);
  }

  u = _mm_unpackhi_epi64(in[4], in[4]);
  in[8] = _mm_cvtepi16_epi32(in[4]);
  in[9] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[5], in[5]);
  in[10] = _mm_cvtepi16_epi32(in[5]);
  in[11] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[6], in[6]);
  in[12] = _mm_cvtepi16_epi32(in[6]);
  in[13] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[7], in[7]);
  in[14] = _mm_cvtepi16_epi32(in[7]);
  in[15] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[3], in[3]);
  in[6] = _mm_cvtepi16_epi32(in[3]);
  in[7] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[2], in[2]);
  in[4] = _mm_cvtepi16_epi32(in[2]);
  in[5] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[1], in[1]);
  in[2] = _mm_cvtepi16_epi32(in[1]);
  in[3] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[0], in[0]);
  in[0] = _mm_cvtepi16_epi32(in[0]);
  in[1] = _mm_cvtepi16_epi32(u);

  in[0] = _mm_slli_epi32(in[0], shift);
  in[1] = _mm_slli_epi32(in[1], shift);
  in[2] = _mm_slli_epi32(in[2], shift);
  in[3] = _mm_slli_epi32(in[3], shift);
  in[4] = _mm_slli_epi32(in[4], shift);
  in[5] = _mm_slli_epi32(in[5], shift);
  in[6] = _mm_slli_epi32(in[6], shift);
  in[7] = _mm_slli_epi32(in[7], shift);

  in[8] = _mm_slli_epi32(in[8], shift);
  in[9] = _mm_slli_epi32(in[9], shift);
  in[10] = _mm_slli_epi32(in[10], shift);
  in[11] = _mm_slli_epi32(in[11], shift);
  in[12] = _mm_slli_epi32(in[12], shift);
  in[13] = _mm_slli_epi32(in[13], shift);
  in[14] = _mm_slli_epi32(in[14], shift);
  in[15] = _mm_slli_epi32(in[15], shift);
}